

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O2

void google::protobuf::compiler::javanano::anon_unknown_3::LoadEnumValues
               (Params *params,EnumDescriptor *enum_descriptor,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *canonical_values)

{
  long lVar1;
  EnumValueDescriptor *pEVar2;
  EnumDescriptor *in_RCX;
  long lVar3;
  EnumValueDescriptor *pEVar4;
  long lVar5;
  string enum_class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ClassName_abi_cxx11_(&local_90,(javanano *)params,(Params *)enum_descriptor,in_RCX);
  lVar5 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(enum_descriptor + 0x2c); lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(enum_descriptor + 0x30);
    pEVar2 = EnumDescriptor::FindValueByNumber(enum_descriptor,*(int *)(lVar1 + 0x10 + lVar5));
    pEVar4 = (EnumValueDescriptor *)(lVar1 + lVar5);
    if (pEVar4 == pEVar2) {
      std::operator+(&local_b0,&local_90,".");
      RenameJavaKeywords(&local_70,*(string **)pEVar4);
      std::operator+(&local_50,&local_b0,&local_70);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 canonical_values,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    lVar5 = lVar5 + 0x28;
  }
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void LoadEnumValues(const Params& params,
    const EnumDescriptor* enum_descriptor, vector<string>* canonical_values) {
  string enum_class_name = ClassName(params, enum_descriptor);
  for (int i = 0; i < enum_descriptor->value_count(); i++) {
    const EnumValueDescriptor* value = enum_descriptor->value(i);
    const EnumValueDescriptor* canonical_value =
        enum_descriptor->FindValueByNumber(value->number());
    if (value == canonical_value) {
      canonical_values->push_back(
          enum_class_name + "." + RenameJavaKeywords(value->name()));
    }
  }
}